

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float64 roundAndPackFloat64(flag zSign,int zExp,uint64_t zSig,float_status *status)

{
  char cVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  
  uVar4 = (ulong)(uint)zExp;
  cVar1 = status->float_rounding_mode;
  switch(cVar1) {
  case '\0':
  case '\x04':
    uVar5 = 0x200;
    break;
  case '\x01':
    uVar5 = 0x3ff;
    if (zSign == '\0') {
      uVar5 = 0;
    }
    break;
  case '\x02':
    uVar5 = 0x3ff;
    if (zSign != '\0') {
      uVar5 = 0;
    }
    break;
  case '\x03':
    uVar5 = 0;
    break;
  case '\x05':
    uVar5 = 0x3ff;
    if (((uint)zSig >> 10 & 1) != 0) {
      uVar5 = 0;
    }
    break;
  default:
    abort();
  }
  uVar2 = (uint)zSig & 0x3ff;
  if (0x7fc < (zExp & 0xffffU)) {
    if ((0x7fd < zExp) || ((lVar6 = uVar5 + zSig, zExp == 0x7fd && (lVar6 < 0)))) {
      status->float_exception_flags = status->float_exception_flags | 0x28;
      return (((ulong)zSign << 0x3f) - (ulong)(uVar5 == 0 || cVar1 == '\x05')) + 0x7ff0000000000000;
    }
    if (zExp < 0) {
      if (status->flush_to_zero != '\0') {
        status->float_exception_flags = status->float_exception_flags | 0x80;
        return (ulong)zSign << 0x3f;
      }
      if (zExp < -0x3f) {
        zSig = (uint64_t)(zSig != 0);
      }
      else {
        zSig = (ulong)(zSig << ((byte)zExp & 0x3f) != 0) | zSig >> (-(byte)zExp & 0x3f);
      }
      uVar2 = (uint)zSig & 0x3ff;
      if (((-1 < lVar6 || zExp != -1) || status->float_detect_tininess == '\x01') &&
          (zSig & 0x3ff) != 0) {
        status->float_exception_flags = status->float_exception_flags | 0x10;
      }
      uVar4 = 0;
      if (cVar1 == '\x05') {
        uVar4 = 0;
        uVar5 = 0x3ff;
        if (((uint)zSig >> 10 & 1) != 0) {
          uVar5 = 0;
        }
      }
    }
  }
  if (uVar2 != 0) {
    status->float_exception_flags = status->float_exception_flags | 0x20;
  }
  uVar3 = ~(ulong)(uVar2 == 0x200 && cVar1 == '\0') & zSig + uVar5 >> 10;
  lVar6 = uVar4 << 0x34;
  if (uVar3 == 0) {
    lVar6 = 0;
  }
  return ((ulong)zSign << 0x3f | uVar3) + lVar6;
}

Assistant:

static float64 roundAndPackFloat64(flag zSign, int zExp, uint64_t zSig,
                                   float_status *status)
{
    int8_t roundingMode;
    flag roundNearestEven;
    int roundIncrement, roundBits;
    flag isTiny;

    roundingMode = status->float_rounding_mode;
    roundNearestEven = ( roundingMode == float_round_nearest_even );
    switch (roundingMode) {
    case float_round_nearest_even:
    case float_round_ties_away:
        roundIncrement = 0x200;
        break;
    case float_round_to_zero:
        roundIncrement = 0;
        break;
    case float_round_up:
        roundIncrement = zSign ? 0 : 0x3ff;
        break;
    case float_round_down:
        roundIncrement = zSign ? 0x3ff : 0;
        break;
    case float_round_to_odd:
        roundIncrement = (zSig & 0x400) ? 0 : 0x3ff;
        break;
    default:
        abort();
    }
    roundBits = zSig & 0x3FF;
    if ( 0x7FD <= (uint16_t) zExp ) {
        if (    ( 0x7FD < zExp )
             || (    ( zExp == 0x7FD )
                  && ( (int64_t) ( zSig + roundIncrement ) < 0 ) )
           ) {
            bool overflow_to_inf = roundingMode != float_round_to_odd &&
                                   roundIncrement != 0;
            float_raise(float_flag_overflow | float_flag_inexact, status);
            return packFloat64(zSign, 0x7FF, -(!overflow_to_inf));
        }
        if ( zExp < 0 ) {
            if (status->flush_to_zero) {
                float_raise(float_flag_output_denormal, status);
                return packFloat64(zSign, 0, 0);
            }
            isTiny =
                   (status->float_detect_tininess
                    == float_tininess_before_rounding)
                || ( zExp < -1 )
                || ( zSig + roundIncrement < UINT64_C(0x8000000000000000) );
            shift64RightJamming( zSig, - zExp, &zSig );
            zExp = 0;
            roundBits = zSig & 0x3FF;
            if (isTiny && roundBits) {
                float_raise(float_flag_underflow, status);
            }
            if (roundingMode == float_round_to_odd) {
                /*
                 * For round-to-odd case, the roundIncrement depends on
                 * zSig which just changed.
                 */
                roundIncrement = (zSig & 0x400) ? 0 : 0x3ff;
            }
        }
    }
    if (roundBits) {
        status->float_exception_flags |= float_flag_inexact;
    }
    zSig = ( zSig + roundIncrement )>>10;
    zSig &= ~ ( ( ( roundBits ^ 0x200 ) == 0 ) & roundNearestEven );
    if ( zSig == 0 ) zExp = 0;
    return packFloat64( zSign, zExp, zSig );

}